

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDarCleanupAig(Abc_Ntk_t *pNtk,int fCleanupPis,int fCleanupPos,int fVerbose)

{
  uint uVar1;
  Aig_Man_t *p;
  char *pcVar2;
  int Temp_1;
  int Temp;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  int fVerbose_local;
  int fCleanupPos_local;
  int fCleanupPis_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    if ((fCleanupPis != 0) && (uVar1 = Aig_ManCiCleanup(p), fVerbose != 0)) {
      Abc_Print(1,"Cleanup removed %d primary inputs without fanout.\n",(ulong)uVar1);
    }
    if ((fCleanupPos != 0) && (uVar1 = Aig_ManCoCleanup(p), fVerbose != 0)) {
      Abc_Print(1,"Cleanup removed %d primary outputs driven by const-0.\n",(ulong)uVar1);
    }
    pNtk_local = Abc_NtkFromAigPhase(p);
    pcVar2 = Extra_UtilStrsav(pNtk->pName);
    pNtk_local->pName = pcVar2;
    pcVar2 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_local->pSpec = pcVar2;
    Aig_ManStop(p);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarCleanupAig( Abc_Ntk_t * pNtk, int fCleanupPis, int fCleanupPos, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    if ( fCleanupPis )
    {
        int Temp = Aig_ManCiCleanup( pMan );
        if ( fVerbose )
            Abc_Print( 1, "Cleanup removed %d primary inputs without fanout.\n", Temp );                                                                     
    }
    if ( fCleanupPos )
    {
        int Temp = Aig_ManCoCleanup( pMan );
        if ( fVerbose )
            Abc_Print( 1, "Cleanup removed %d primary outputs driven by const-0.\n", Temp );                                                                     
    }
    pNtkAig = Abc_NtkFromAigPhase( pMan );
    pNtkAig->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkAig->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Aig_ManStop( pMan );
    return pNtkAig;
}